

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,LengthWithCavity *lengthWithCavity)

{
  LengthWithCavity *pLVar1;
  LengthUnit *attribute;
  function<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)> local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  LengthWithCavity *local_18;
  LengthWithCavity *lengthWithCavity_local;
  XMLNodeAdapter *node_local;
  
  local_18 = lengthWithCavity;
  lengthWithCavity_local = (LengthWithCavity *)node;
  FileParse::operator>>(node,&lengthWithCavity->value);
  pLVar1 = lengthWithCavity_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cavity",&local_39);
  FileParse::loadAttribute<XMLNodeAdapter,_int,_0>
            ((XMLNodeAdapter *)pLVar1,&local_38,&local_18->cavity);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pLVar1 = lengthWithCavity_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"unit",&local_71);
  attribute = &local_18->unit;
  std::function<BSDFData::LengthUnit(std::basic_string_view<char,std::char_traits<char>>)>::
  function<BSDFData::LengthUnit(&)(std::basic_string_view<char,std::char_traits<char>>),void>
            ((function<BSDFData::LengthUnit(std::basic_string_view<char,std::char_traits<char>>)> *)
             &local_98,LengthUnitFromString);
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::LengthUnit,_0>
            ((XMLNodeAdapter *)pLVar1,&local_70,attribute,&local_98);
  std::function<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return (XMLNodeAdapter *)lengthWithCavity_local;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::LengthWithCavity & lengthWithCavity)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        node >> lengthWithCavity.value;
        FileParse::loadAttribute(node, "cavity", lengthWithCavity.cavity);
        FileParse::loadAttribute<NodeAdapter, BSDFData::LengthUnit>(
          node, "unit", lengthWithCavity.unit, LengthUnitFromString);

        return node;
    }